

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::resolveProcessorInstance
          (QualifiedIdentifierResolver *this,CallOrCast *call,ProcessorBase *p)

{
  ModuleBase *pMVar1;
  ProcessorBase *processor;
  size_type sVar2;
  size_t sVar3;
  pool_ptr<soul::AST::CommaSeparatedList> local_38;
  pool_ptr<soul::AST::Expression> local_30;
  ProcessorBase *local_28;
  ProcessorBase *p_local;
  CallOrCast *call_local;
  QualifiedIdentifierResolver *this_local;
  
  local_28 = p;
  p_local = (ProcessorBase *)call;
  call_local = (CallOrCast *)this;
  sVar2 = std::
          vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
          ::size(&(p->super_ModuleBase).specialisationParams);
  sVar3 = AST::CallOrCastBase::getNumArguments((CallOrCastBase *)p_local);
  processor = local_28;
  if (sVar2 == sVar3) {
    pMVar1 = &p_local->super_ModuleBase;
    local_38.object =
         (CommaSeparatedList *)
         (p_local->super_ModuleBase).processorKeywordLocation.sourceCode.object;
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::CommaSeparatedList,void>
              (&local_30,&local_38);
    this_local = (QualifiedIdentifierResolver *)
                 getOrCreateImplicitProcessorInstance
                           (this,&(pMVar1->super_ASTObject).context,processor,&local_30);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_30);
    pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_38);
  }
  else {
    this_local = (QualifiedIdentifierResolver *)p_local;
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& resolveProcessorInstance (AST::CallOrCast& call, AST::ProcessorBase& p)
        {
            if (p.specialisationParams.size() == call.getNumArguments())
                return getOrCreateImplicitProcessorInstance (call.context, p, call.arguments);

            return call;
        }